

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O3

int Ivy_ObjRefDeref(Ivy_Man_t *p,Ivy_Obj_t *pNode,int fReference,int fLabel)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Ivy_Obj_t *pNode_00;
  int local_34;
  
  local_34 = 0;
  while( true ) {
    iVar4 = 0;
    while( true ) {
      if (fLabel != 0) {
        pNode->TravId = p->nTravIds;
      }
      uVar3 = *(uint *)&pNode->field_0x8 & 0xf;
      if (uVar3 == 1) {
        uVar3 = 0;
        goto LAB_007b13a7;
      }
      if ((*(uint *)&pNode->field_0x8 & 0xc) != 4) {
        __assert_fail("Ivy_ObjIsNode(pNode) || Ivy_ObjIsBuf(pNode) || Ivy_ObjIsLatch(pNode)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyUtil.c"
                      ,0x143,"int Ivy_ObjRefDeref(Ivy_Man_t *, Ivy_Obj_t *, int, int)");
      }
      pNode_00 = (Ivy_Obj_t *)((ulong)pNode->pFanin0 & 0xfffffffffffffffe);
      pNode = (Ivy_Obj_t *)((ulong)pNode->pFanin1 & 0xfffffffffffffffe);
      iVar2 = pNode_00->nRefs;
      uVar3 = (uint)(uVar3 - 5 < 2);
      if (fReference == 0) break;
      pNode_00->nRefs = iVar2 + 1;
      if (iVar2 == 0) {
        iVar2 = Ivy_ObjRefDeref(p,pNode_00,fReference,fLabel);
        uVar3 = uVar3 + iVar2;
      }
      if ((pNode == (Ivy_Obj_t *)0x0) ||
         (iVar2 = pNode->nRefs, pNode->nRefs = iVar2 + 1, iVar2 != 0)) goto LAB_007b13a7;
      iVar4 = iVar4 + uVar3;
    }
    if (iVar2 < 1) {
      __assert_fail("pNode0->nRefs > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyUtil.c"
                    ,0x151,"int Ivy_ObjRefDeref(Ivy_Man_t *, Ivy_Obj_t *, int, int)");
    }
    if ((pNode != (Ivy_Obj_t *)0x0) && (pNode->nRefs < 1)) {
      __assert_fail("pNode1 == NULL || pNode1->nRefs > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyUtil.c"
                    ,0x152,"int Ivy_ObjRefDeref(Ivy_Man_t *, Ivy_Obj_t *, int, int)");
    }
    pNode_00->nRefs = iVar2 + -1;
    if (iVar2 + -1 == 0) {
      iVar4 = Ivy_ObjRefDeref(p,pNode_00,0,fLabel);
      uVar3 = uVar3 + iVar4;
    }
    iVar4 = 0;
    if (pNode == (Ivy_Obj_t *)0x0) break;
    piVar1 = &pNode->nRefs;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 != 0) break;
    local_34 = local_34 + uVar3;
    fReference = 0;
  }
LAB_007b13a7:
  return iVar4 + local_34 + uVar3;
}

Assistant:

int Ivy_ObjRefDeref( Ivy_Man_t * p, Ivy_Obj_t * pNode, int fReference, int fLabel )
{
    Ivy_Obj_t * pNode0, * pNode1;
    int Counter;
    // label visited nodes
    if ( fLabel )
        Ivy_ObjSetTravIdCurrent( p, pNode );
    // skip the CI
    if ( Ivy_ObjIsPi(pNode) )
        return 0;
    assert( Ivy_ObjIsNode(pNode) || Ivy_ObjIsBuf(pNode) || Ivy_ObjIsLatch(pNode) );
    // process the internal node
    pNode0 = Ivy_ObjFanin0(pNode);
    pNode1 = Ivy_ObjFanin1(pNode);
    Counter = Ivy_ObjIsNode(pNode);
    if ( fReference )
    {
        if ( pNode0->nRefs++ == 0 )
            Counter += Ivy_ObjRefDeref( p, pNode0, fReference, fLabel );
        if ( pNode1 && pNode1->nRefs++ == 0 )
            Counter += Ivy_ObjRefDeref( p, pNode1, fReference, fLabel );
    }
    else
    {
        assert( pNode0->nRefs > 0 );
        assert( pNode1 == NULL || pNode1->nRefs > 0 );
        if ( --pNode0->nRefs == 0 )
            Counter += Ivy_ObjRefDeref( p, pNode0, fReference, fLabel );
        if ( pNode1 && --pNode1->nRefs == 0 )
            Counter += Ivy_ObjRefDeref( p, pNode1, fReference, fLabel );
    }
    return Counter;
}